

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

void __thiscall
Filter::Filter(Filter *this,int input_size,int output_size,double *learning_rate,string *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FIR *this_00;
  double *pdVar2;
  pointer pcVar3;
  double dVar4;
  Index IVar5;
  Index IVar6;
  int iVar7;
  Clock *pCVar8;
  int *piVar9;
  long lVar10;
  undefined8 uVar11;
  string filterType;
  string cutoffFreq;
  DenseStorage<double,__1,__1,__1,_0> local_88;
  long *local_70 [2];
  long local_60 [2];
  double *local_50 [2];
  double local_40 [2];
  
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR_forward_0011cc00;
  paVar1 = &(this->type).field_2;
  (this->type)._M_dataplus._M_p = (pointer)paVar1;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  this_00 = &this->filter;
  (this->filter).coeff.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filter).coeff.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter).coeff.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter).freq.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filter).freq.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter).freq.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filter).buff.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filter).buff.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter).buff.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  pCVar8 = Clock::getInstance();
  this->clock = pCVar8;
  std::__cxx11::string::find((char)type,0x2c);
  std::__cxx11::string::substr((ulong)local_70,(ulong)type);
  std::__cxx11::string::substr((ulong)local_50,(ulong)type);
  pdVar2 = local_50[0];
  piVar9 = __errno_location();
  iVar7 = *piVar9;
  *piVar9 = 0;
  lVar10 = strtol((char *)pdVar2,(char **)&local_88,10);
  if (local_88.m_data == pdVar2) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar10 == lVar10) && (*piVar9 != 0x22)) {
    if (*piVar9 == 0) {
      *piVar9 = iVar7;
    }
    dVar4 = Clock::getDt(this->clock);
    local_88.m_data = (double *)0x0;
    local_88.m_rows = 0;
    local_88.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_88,1,1,1);
    dVar4 = (double)(int)lVar10 / (1.0 / dVar4);
    pdVar2 = (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         = local_88.m_data;
    IVar5 = (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    IVar6 = (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         = local_88.m_rows;
    (this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = local_88.m_cols;
    local_88.m_data = pdVar2;
    local_88.m_rows = IVar5;
    local_88.m_cols = IVar6;
    free(pdVar2);
    iVar7 = std::__cxx11::string::compare((char *)local_70);
    if (iVar7 == 0) {
      FIR::lowpass(this_00,2000,dVar4);
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)local_70);
      if (iVar7 == 0) {
        FIR::highpass(this_00,2000,dVar4);
      }
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],(long)local_40[0] + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    return;
  }
  uVar11 = std::__throw_out_of_range("stoi");
  free(local_88.m_data);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],(long)local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  free((this->output).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  FIR::~FIR(this_00);
  pcVar3 = (this->type)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar11);
}

Assistant:

Filter::Filter(int input_size, int output_size, double* learning_rate, string type) {
    clock = Clock::getInstance();
    int pos = type.find_first_of(',');
    string filterType = type.substr(0, pos);
    string cutoffFreq = type.substr(pos+1);
    double normalizedFreq = stoi(cutoffFreq) / (1.0 / clock->getDt());
    output = Eigen::MatrixXd(1, 1);
    if(filterType == "lowpass") {
        filter.lowpass(2000, normalizedFreq);
    }
    else if(filterType == "highpass") {
        filter.highpass(2000, normalizedFreq);
    }
}